

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

STORAGE_TYPE * __thiscall
duckdb::BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan>::SortAndGetHeap
          (BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::GreaterThan> *this)

{
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_> *__last;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_> *__first;
  long lVar1;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  __cmp;
  _Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&,_const_std::pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_>_&)>
  local_28;
  
  __first = this->heap;
  local_28._M_comp = Compare;
  if (1 < (long)this->size) {
    lVar1 = this->size << 6;
    do {
      __last = (pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<duckdb::string_t>_> *)
               ((long)&__first[-1].first.value.value + lVar1);
      std::
      __pop_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<duckdb::string_t>>const&)>>
                (__first,__last,__last,&local_28);
      lVar1 = lVar1 + -0x40;
    } while (0x40 < lVar1);
    __first = this->heap;
  }
  return __first;
}

Assistant:

STORAGE_TYPE *SortAndGetHeap() {
		std::sort_heap(heap, heap + size, Compare);
		return heap;
	}